

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qanimationgroup.cpp
# Opt level: O1

void __thiscall QAnimationGroupPrivate::clear(QAnimationGroupPrivate *this,bool onDestruction)

{
  QArrayData *data;
  QAbstractAnimation **ppQVar1;
  long lVar2;
  QObject *this_00;
  bool bVar3;
  long lVar4;
  
  data = &((this->animations).d.d)->super_QArrayData;
  ppQVar1 = (this->animations).d.ptr;
  lVar2 = (this->animations).d.size;
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QList<QAbstractAnimation_*>::clear(&this->animations);
  if (lVar2 != 0) {
    do {
      lVar4 = lVar2 + -1;
      this_00 = &ppQVar1[lVar4]->super_QObject;
      QObject::setParent(this_00,(QObject *)0x0);
      (this_00->d_ptr).d[1].bindingStorage.bindingStatus = (QBindingStatus *)0x0;
      if (!onDestruction) {
        (*(this->super_QAbstractAnimationPrivate).super_QObjectPrivate.super_QObjectData.
          _vptr_QObjectData[5])(this,lVar4,this_00);
      }
      (*this_00->_vptr_QObject[4])(this_00);
      bVar3 = 1 < lVar2;
      lVar2 = lVar4;
    } while (bVar3);
  }
  if (data != (QArrayData *)0x0) {
    LOCK();
    (data->ref_)._q_value.super___atomic_base<int>._M_i =
         (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(data,8,0x10);
      return;
    }
  }
  return;
}

Assistant:

void QAnimationGroupPrivate::clear(bool onDestruction)
{
    const QList<QAbstractAnimation *> animationsCopy = animations; // taking a copy
    animations.clear();
    // Clearing backwards so the indices doesn't change while we remove animations.
    for (qsizetype i = animationsCopy.size() - 1; i >= 0; --i) {
        QAbstractAnimation *animation = animationsCopy.at(i);
        animation->setParent(nullptr);
        QAbstractAnimationPrivate::get(animation)->group = nullptr;
        // If we are in ~QAnimationGroup() it is not safe to called the virtual
        // animationRemoved method, which can still be a method in a
        // QAnimationGroupPrivate derived class that assumes q_ptr is still
        // a valid derived class of QAnimationGroup.
        if (!onDestruction)
            animationRemoved(i, animation);
        delete animation;
    }
}